

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall
VulkanHppGenerator::checkRequireDependenciesCorrectness
          (VulkanHppGenerator *this,RequireData *require,string *section,string *name)

{
  int iVar1;
  _Base_ptr p_Var2;
  __type_conflict _Var3;
  bool bVar4;
  bool condition;
  size_type __n;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  _Base_ptr p_Var7;
  pointer this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string member;
  string structure;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&structure,",+()",(allocator<char> *)&member);
  anon_unknown.dwarf_dd40c::tokenizeAny(&dependencies,&require->depends,&structure);
  std::__cxx11::string::~string((string *)&structure);
  for (this_01 = dependencies.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      dependencies.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (this_01,"::",0);
    if (__n == 0xffffffffffffffff) {
      bVar4 = isFeature(this,this_01);
      condition = true;
      if (!bVar4) {
        condition = isExtension(this,this_01);
      }
      iVar1 = require->xmlLine;
      std::operator+(&local_180,section," <");
      std::operator+(&local_160,&local_180,name);
      std::operator+(&local_e8,&local_160,"> depends on unknown extension or feature <");
      std::operator+(&member,&local_e8,this_01);
      std::operator+(&structure,&member,">");
      checkForError(condition,iVar1,&structure);
      std::__cxx11::string::~string((string *)&structure);
      std::__cxx11::string::~string((string *)&member);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_160);
      this_00 = &local_180;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&structure,this_01,0,__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&member,this_01,__n + 2,0xffffffffffffffff);
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
              ::find(&(this->m_structs)._M_t,&structure);
      iVar1 = require->xmlLine;
      std::operator+(&local_b0,section," <");
      std::operator+(&local_90,&local_b0,name);
      std::operator+(&local_180,&local_90,"> requires member of an unknown struct <");
      std::operator+(&local_160,&local_180,&structure);
      std::operator+(&local_e8,&local_160,">");
      checkForError((_Rb_tree_header *)cVar5._M_node !=
                    &(this->m_structs)._M_t._M_impl.super__Rb_tree_header,iVar1,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      p_Var6 = cVar5._M_node[3]._M_right;
      p_Var2 = *(_Base_ptr *)(cVar5._M_node + 4);
      while ((p_Var7 = p_Var2, p_Var6 != p_Var2 &&
             (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var6 + 4),&member), p_Var7 = p_Var6, !_Var3))) {
        p_Var6 = (_Base_ptr)&p_Var6[0xc]._M_right;
      }
      p_Var6 = *(_Base_ptr *)(cVar5._M_node + 4);
      iVar1 = require->xmlLine;
      std::operator+(&local_70,section," <");
      std::operator+(&local_50,&local_70,name);
      std::operator+(&local_b0,&local_50,"> requires unknown member <");
      std::operator+(&local_90,&local_b0,&member);
      std::operator+(&local_180,&local_90,"> as part of the struct <");
      std::operator+(&local_160,&local_180,&structure);
      std::operator+(&local_e8,&local_160,">");
      checkForError(p_Var7 != p_Var6,iVar1,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&member);
      this_00 = &structure;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dependencies);
  return;
}

Assistant:

void VulkanHppGenerator::checkRequireDependenciesCorrectness( RequireData const & require, std::string const & section, std::string const & name ) const
{
  std::vector<std::string> dependencies = tokenizeAny( require.depends, ",+()" );
  for ( auto const & depends : dependencies )
  {
    size_t separatorPos = depends.find( "::" );
    if ( separatorPos == std::string::npos )
    {
      checkForError( isFeature( depends ) || isExtension( depends ),
                     require.xmlLine,
                     section + " <" + name + "> depends on unknown extension or feature <" + depends + ">" );
    }
    else
    {
      std::string structure = depends.substr( 0, separatorPos );
      std::string member    = depends.substr( separatorPos + 2 );
      auto        structIt  = m_structs.find( structure );
      checkForError( structIt != m_structs.end(), require.xmlLine, section + " <" + name + "> requires member of an unknown struct <" + structure + ">" );
      checkForError( std::ranges::find_if( structIt->second.members, [&member]( auto const & md ) { return md.name == member; } ) !=
                       structIt->second.members.end(),
                     require.xmlLine,
                     section + " <" + name + "> requires unknown member <" + member + "> as part of the struct <" + structure + ">" );
    }
  }
}